

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

void gen_mipsdsp_accinsn(DisasContext_conflict6 *ctx,uint32_t op1,uint32_t op2,int ret,int v1,int v2
                        ,int check_ret)

{
  uint uVar1;
  TCGContext_conflict6 *s;
  TCGv_i64 pTVar2;
  TCGTemp *pTVar3;
  TCGTemp *a1;
  TCGTemp *a1_00;
  int nargs;
  uintptr_t o_3;
  TCGv_i64 pTVar4;
  TCGOpcode opc;
  code *func;
  uintptr_t o_76;
  uintptr_t o_2;
  TCGv_i64 pTVar5;
  uintptr_t o_4;
  TCGv_i64 pTVar6;
  TCGTemp *local_68;
  TCGv_i64 local_60;
  TCGv_ptr local_58;
  DisasContext_conflict6 *local_48;
  TCGTemp *local_40;
  uint32_t local_34;
  
  if (check_ret == 1 && ret == 0) {
    return;
  }
  s = ctx->uc->tcg_ctx;
  local_48 = ctx;
  local_34 = op1;
  local_40 = tcg_temp_new_internal_mips64el(s,TCG_TYPE_I64,false);
  pTVar3 = tcg_temp_new_internal_mips64el(s,TCG_TYPE_I64,false);
  a1 = tcg_temp_new_internal_mips64el(s,TCG_TYPE_I64,false);
  pTVar6 = (TCGv_i64)((long)a1 - (long)s);
  a1_00 = tcg_temp_new_internal_mips64el(s,TCG_TYPE_I64,false);
  if (v1 == 0) {
    opc = INDEX_op_movi_i64;
    pTVar4 = (TCGv_i64)0x0;
LAB_009a9f2e:
    tcg_gen_op2_mips64el(s,opc,(TCGArg)a1,(TCGArg)pTVar4);
  }
  else if (s->cpu_gpr[v1] != pTVar6) {
    pTVar4 = (TCGv_i64)((long)&s->pool_cur + (long)s->cpu_gpr[v1]);
    opc = INDEX_op_mov_i64;
    goto LAB_009a9f2e;
  }
  if (v2 == 0) {
    tcg_gen_op2_mips64el(s,INDEX_op_movi_i64,(TCGArg)a1_00,0);
  }
  else if (s->cpu_gpr[v2] != (TCGv_i64)((long)a1_00 - (long)s)) {
    tcg_gen_op2_mips64el
              (s,INDEX_op_mov_i64,(TCGArg)a1_00,(TCGArg)((long)&s->pool_cur + (long)s->cpu_gpr[v2]))
    ;
  }
  pTVar5 = (TCGv_i64)((long)local_40 - (long)s);
  pTVar4 = (TCGv_i64)((long)pTVar3 - (long)s);
  if (local_34 != 0x7c00003c) {
    if (local_34 != 0x7c000038) goto switchD_009a9fdc_caseD_8;
    if ((local_48->hflags & 0x80000) == 0) {
      gen_mipsdsp_accinsn_cold_2();
    }
    switch((op2 + 0x83ffffc8) * 0x4000000 | op2 + 0x83ffffc8 >> 6) {
    case 0:
      tcg_gen_op2_mips64el(s,INDEX_op_movi_i64,(TCGArg)local_40,(ulong)(uint)v2);
      tcg_gen_op2_mips64el(s,INDEX_op_movi_i64,(TCGArg)pTVar3,(ulong)(uint)v1);
      local_58 = s->cpu_env;
      pTVar2 = s->cpu_gpr[(uint)ret];
      local_60 = pTVar4;
      goto LAB_009aa24a;
    case 1:
      tcg_gen_op2_mips64el(s,INDEX_op_movi_i64,(TCGArg)local_40,(ulong)(uint)v2);
      local_58 = s->cpu_env;
      pTVar2 = s->cpu_gpr[(uint)ret];
      local_60 = pTVar6;
LAB_009aa24a:
      local_60 = local_60 + (long)&s->pool_cur;
      pTVar3 = (TCGTemp *)((long)&s->pool_cur + (long)pTVar2);
      local_58 = local_58 + (long)s;
      func = helper_extr_w_mips64el;
      goto LAB_009aab52;
    case 2:
      tcg_gen_op2_mips64el(s,INDEX_op_movi_i64,(TCGArg)local_40,(ulong)(uint)v2);
      tcg_gen_op2_mips64el(s,INDEX_op_movi_i64,(TCGArg)pTVar3,(ulong)(uint)v1);
      local_58 = s->cpu_env;
      pTVar2 = s->cpu_gpr[(uint)ret];
      local_60 = pTVar4;
      goto LAB_009aa386;
    case 3:
      tcg_gen_op2_mips64el(s,INDEX_op_movi_i64,(TCGArg)local_40,(ulong)(uint)v2);
      local_58 = s->cpu_env;
      pTVar2 = s->cpu_gpr[(uint)ret];
      local_60 = pTVar6;
LAB_009aa386:
      local_60 = local_60 + (long)&s->pool_cur;
      pTVar3 = (TCGTemp *)((long)&s->pool_cur + (long)pTVar2);
      local_58 = local_58 + (long)s;
      func = helper_extp_mips64el;
      goto LAB_009aab52;
    case 4:
      tcg_gen_op2_mips64el(s,INDEX_op_movi_i64,(TCGArg)local_40,(ulong)(uint)v2);
      tcg_gen_op2_mips64el(s,INDEX_op_movi_i64,(TCGArg)pTVar3,(ulong)(uint)v1);
      local_58 = s->cpu_env;
      pTVar2 = s->cpu_gpr[(uint)ret];
      local_60 = pTVar4;
      goto LAB_009aa298;
    case 5:
      tcg_gen_op2_mips64el(s,INDEX_op_movi_i64,(TCGArg)local_40,(ulong)(uint)v2);
      local_58 = s->cpu_env;
      pTVar2 = s->cpu_gpr[(uint)ret];
      local_60 = pTVar6;
LAB_009aa298:
      local_60 = local_60 + (long)&s->pool_cur;
      pTVar3 = (TCGTemp *)((long)&s->pool_cur + (long)pTVar2);
      local_58 = local_58 + (long)s;
      func = helper_extr_r_w_mips64el;
      goto LAB_009aab52;
    case 6:
      tcg_gen_op2_mips64el(s,INDEX_op_movi_i64,(TCGArg)local_40,(ulong)(uint)v2);
      tcg_gen_op2_mips64el(s,INDEX_op_movi_i64,(TCGArg)pTVar3,(ulong)(uint)v1);
      local_58 = s->cpu_env;
      pTVar2 = s->cpu_gpr[(uint)ret];
      local_60 = pTVar4;
      goto LAB_009aa426;
    case 7:
      tcg_gen_op2_mips64el(s,INDEX_op_movi_i64,(TCGArg)local_40,(ulong)(uint)v2);
      local_58 = s->cpu_env;
      pTVar2 = s->cpu_gpr[(uint)ret];
      local_60 = pTVar6;
LAB_009aa426:
      local_60 = local_60 + (long)&s->pool_cur;
      pTVar3 = (TCGTemp *)((long)&s->pool_cur + (long)pTVar2);
      local_58 = local_58 + (long)s;
      func = helper_extr_rs_w_mips64el;
      goto LAB_009aab52;
    default:
      goto switchD_009a9fdc_caseD_8;
    case 10:
      tcg_gen_op2_mips64el(s,INDEX_op_movi_i64,(TCGArg)local_40,(ulong)(uint)v2);
      tcg_gen_op2_mips64el(s,INDEX_op_movi_i64,(TCGArg)pTVar3,(ulong)(uint)v1);
      local_58 = s->cpu_env;
      pTVar2 = s->cpu_gpr[(uint)ret];
      local_60 = pTVar4;
      goto LAB_009aa55c;
    case 0xb:
      tcg_gen_op2_mips64el(s,INDEX_op_movi_i64,(TCGArg)local_40,(ulong)(uint)v2);
      local_58 = s->cpu_env;
      pTVar2 = s->cpu_gpr[(uint)ret];
      local_60 = pTVar6;
LAB_009aa55c:
      local_60 = local_60 + (long)&s->pool_cur;
      pTVar3 = (TCGTemp *)((long)&s->pool_cur + (long)pTVar2);
      local_58 = local_58 + (long)s;
      func = helper_extpdp_mips64el;
      goto LAB_009aab52;
    case 0xe:
      tcg_gen_op2_mips64el(s,INDEX_op_movi_i64,(TCGArg)local_40,(ulong)(uint)v2);
      tcg_gen_op2_mips64el(s,INDEX_op_movi_i64,(TCGArg)pTVar3,(ulong)(uint)v1);
      local_58 = s->cpu_env;
      pTVar2 = s->cpu_gpr[(uint)ret];
      local_60 = pTVar4;
      goto LAB_009aa2e6;
    case 0xf:
      tcg_gen_op2_mips64el(s,INDEX_op_movi_i64,(TCGArg)local_40,(ulong)(uint)v2);
      local_58 = s->cpu_env;
      pTVar2 = s->cpu_gpr[(uint)ret];
      local_60 = pTVar6;
LAB_009aa2e6:
      local_60 = local_60 + (long)&s->pool_cur;
      pTVar3 = (TCGTemp *)((long)&s->pool_cur + (long)pTVar2);
      local_58 = local_58 + (long)s;
      func = helper_extr_s_h_mips64el;
      goto LAB_009aab52;
    case 0x12:
      tcg_gen_op2_mips64el
                (s,INDEX_op_movi_i64,(TCGArg)local_40,
                 (ulong)(*(ushort *)((long)&local_48->opcode + 2) & 0x3ff));
      local_60 = (TCGv_i64)(s->cpu_env + (long)s);
      pTVar3 = (TCGTemp *)((long)&s->pool_cur + (long)s->cpu_gpr[(uint)ret]);
      local_68 = (TCGTemp *)((long)s + (long)pTVar5);
      func = helper_rddsp_mips64el;
      nargs = 2;
      goto LAB_009aab5a;
    case 0x13:
      tcg_gen_op2_mips64el
                (s,INDEX_op_movi_i64,(TCGArg)local_40,(ulong)(local_48->opcode >> 0xb & 0x3ff));
      local_58 = s->cpu_env + (long)s;
      local_68 = (TCGTemp *)((long)s + (long)pTVar6);
      local_60 = (TCGv_i64)((long)s + (long)pTVar5);
      func = helper_wrdsp_mips64el;
      break;
    case 0x1a:
      uVar1 = local_48->opcode;
      tcg_gen_op2_mips64el(s,INDEX_op_movi_i64,(TCGArg)local_40,(ulong)(uint)ret);
      tcg_gen_op2_mips64el(s,INDEX_op_movi_i64,(TCGArg)pTVar3,(ulong)(uVar1 >> 0x14 & 0x3f));
      local_58 = s->cpu_env;
      local_60 = pTVar4;
      goto LAB_009aa4bc;
    case 0x1b:
      tcg_gen_op2_mips64el(s,INDEX_op_movi_i64,(TCGArg)local_40,(ulong)(uint)ret);
      local_58 = s->cpu_env;
      local_60 = pTVar6;
LAB_009aa4bc:
      local_68 = (TCGTemp *)((long)s + (long)pTVar5);
      local_60 = local_60 + (long)&s->pool_cur;
      local_58 = local_58 + (long)s;
      func = helper_shilo_mips64el;
      break;
    case 0x1f:
      tcg_gen_op2_mips64el(s,INDEX_op_movi_i64,(TCGArg)local_40,(ulong)(uint)ret);
      local_58 = s->cpu_env + (long)s;
      local_68 = (TCGTemp *)((long)s + (long)pTVar5);
      local_60 = (TCGv_i64)((long)s + (long)pTVar6);
      func = helper_mthlip_mips64el;
    }
    goto LAB_009aabe0;
  }
  if ((local_48->hflags & 0x80000) == 0) {
    gen_mipsdsp_accinsn_cold_1();
  }
  switch((op2 + 0x83ffffc4) * 0x4000000 | op2 + 0x83ffffc4 >> 6) {
  case 0:
    tcg_gen_op2_mips64el(s,INDEX_op_movi_i64,(TCGArg)local_40,(ulong)(uint)v2);
    tcg_gen_op2_mips64el(s,INDEX_op_movi_i64,(TCGArg)pTVar3,(ulong)(uint)v1);
    local_58 = s->cpu_env;
    pTVar2 = s->cpu_gpr[(uint)ret];
    local_60 = pTVar4;
    break;
  case 1:
    tcg_gen_op2_mips64el(s,INDEX_op_movi_i64,(TCGArg)local_40,(ulong)(uint)v2);
    local_58 = s->cpu_env;
    pTVar2 = s->cpu_gpr[(uint)ret];
    local_60 = pTVar6;
    break;
  case 2:
    tcg_gen_op2_mips64el(s,INDEX_op_movi_i64,(TCGArg)local_40,(ulong)(uint)v2);
    tcg_gen_op2_mips64el(s,INDEX_op_movi_i64,(TCGArg)pTVar3,(ulong)(uint)v1);
    local_58 = s->cpu_env;
    pTVar2 = s->cpu_gpr[(uint)ret];
    local_60 = pTVar4;
    goto LAB_009aa99f;
  case 3:
    tcg_gen_op2_mips64el(s,INDEX_op_movi_i64,(TCGArg)local_40,(ulong)(uint)v2);
    local_58 = s->cpu_env;
    pTVar2 = s->cpu_gpr[(uint)ret];
    local_60 = pTVar6;
LAB_009aa99f:
    local_60 = local_60 + (long)&s->pool_cur;
    pTVar3 = (TCGTemp *)((long)&s->pool_cur + (long)pTVar2);
    local_58 = local_58 + (long)s;
    func = helper_dextp_mips64el;
    goto LAB_009aab52;
  case 4:
    tcg_gen_op2_mips64el(s,INDEX_op_movi_i64,(TCGArg)local_40,(ulong)(uint)v2);
    tcg_gen_op2_mips64el(s,INDEX_op_movi_i64,(TCGArg)pTVar3,(ulong)(uint)v1);
    local_58 = s->cpu_env;
    pTVar2 = s->cpu_gpr[(uint)ret];
    local_60 = pTVar4;
    goto LAB_009aaa03;
  case 5:
    tcg_gen_op2_mips64el(s,INDEX_op_movi_i64,(TCGArg)local_40,(ulong)(uint)v2);
    local_58 = s->cpu_env;
    pTVar2 = s->cpu_gpr[(uint)ret];
    local_60 = pTVar6;
LAB_009aaa03:
    local_60 = local_60 + (long)&s->pool_cur;
    pTVar3 = (TCGTemp *)((long)&s->pool_cur + (long)pTVar2);
    local_58 = local_58 + (long)s;
    func = helper_dextr_r_w_mips64el;
    goto LAB_009aab52;
  case 6:
    tcg_gen_op2_mips64el(s,INDEX_op_movi_i64,(TCGArg)local_40,(ulong)(uint)v2);
    tcg_gen_op2_mips64el(s,INDEX_op_movi_i64,(TCGArg)pTVar3,(ulong)(uint)v1);
    local_58 = s->cpu_env;
    pTVar2 = s->cpu_gpr[(uint)ret];
    local_60 = pTVar4;
    goto LAB_009aa8b1;
  case 7:
    tcg_gen_op2_mips64el(s,INDEX_op_movi_i64,(TCGArg)local_40,(ulong)(uint)v2);
    local_58 = s->cpu_env;
    pTVar2 = s->cpu_gpr[(uint)ret];
    local_60 = pTVar6;
LAB_009aa8b1:
    local_60 = local_60 + (long)&s->pool_cur;
    pTVar3 = (TCGTemp *)((long)&s->pool_cur + (long)pTVar2);
    local_58 = local_58 + (long)s;
    func = helper_dextr_rs_w_mips64el;
    goto LAB_009aab52;
  default:
    goto switchD_009a9fdc_caseD_8;
  case 10:
    tcg_gen_op2_mips64el(s,INDEX_op_movi_i64,(TCGArg)local_40,(ulong)(uint)v2);
    tcg_gen_op2_mips64el(s,INDEX_op_movi_i64,(TCGArg)pTVar3,(ulong)(uint)v1);
    local_58 = s->cpu_env;
    pTVar2 = s->cpu_gpr[(uint)ret];
    local_60 = pTVar4;
    goto LAB_009aaaa3;
  case 0xb:
    tcg_gen_op2_mips64el(s,INDEX_op_movi_i64,(TCGArg)local_40,(ulong)(uint)v2);
    local_58 = s->cpu_env;
    pTVar2 = s->cpu_gpr[(uint)ret];
    local_60 = pTVar6;
LAB_009aaaa3:
    local_60 = local_60 + (long)&s->pool_cur;
    pTVar3 = (TCGTemp *)((long)&s->pool_cur + (long)pTVar2);
    local_58 = local_58 + (long)s;
    func = helper_dextpdp_mips64el;
    goto LAB_009aab52;
  case 0xe:
  case 0xf:
    tcg_gen_op2_mips64el(s,INDEX_op_movi_i64,(TCGArg)local_40,(ulong)(uint)v2);
    tcg_gen_op2_mips64el(s,INDEX_op_movi_i64,(TCGArg)pTVar3,(ulong)(uint)v1);
    local_58 = s->cpu_env + (long)s;
    pTVar3 = (TCGTemp *)((long)&s->pool_cur + (long)s->cpu_gpr[(uint)ret]);
    local_60 = (TCGv_i64)((long)s + (long)pTVar4);
    func = helper_dextr_s_h_mips64el;
    goto LAB_009aab52;
  case 0x10:
    tcg_gen_op2_mips64el(s,INDEX_op_movi_i64,(TCGArg)local_40,(ulong)(uint)v2);
    tcg_gen_op2_mips64el(s,INDEX_op_movi_i64,(TCGArg)pTVar3,(ulong)(uint)v1);
    local_58 = s->cpu_env;
    pTVar2 = s->cpu_gpr[(uint)ret];
    local_60 = pTVar4;
    goto LAB_009aa699;
  case 0x11:
    tcg_gen_op2_mips64el(s,INDEX_op_movi_i64,(TCGArg)local_40,(ulong)(uint)v2);
    local_58 = s->cpu_env;
    pTVar2 = s->cpu_gpr[(uint)ret];
    local_60 = pTVar6;
LAB_009aa699:
    local_60 = local_60 + (long)&s->pool_cur;
    pTVar3 = (TCGTemp *)((long)&s->pool_cur + (long)pTVar2);
    local_58 = local_58 + (long)s;
    func = helper_dextr_l_mips64el;
    goto LAB_009aab52;
  case 0x14:
    tcg_gen_op2_mips64el(s,INDEX_op_movi_i64,(TCGArg)local_40,(ulong)(uint)v2);
    tcg_gen_op2_mips64el(s,INDEX_op_movi_i64,(TCGArg)pTVar3,(ulong)(uint)v1);
    local_58 = s->cpu_env;
    pTVar2 = s->cpu_gpr[(uint)ret];
    local_60 = pTVar4;
    goto LAB_009aa951;
  case 0x15:
    tcg_gen_op2_mips64el(s,INDEX_op_movi_i64,(TCGArg)local_40,(ulong)(uint)v2);
    local_58 = s->cpu_env;
    pTVar2 = s->cpu_gpr[(uint)ret];
    local_60 = pTVar6;
LAB_009aa951:
    local_60 = local_60 + (long)&s->pool_cur;
    pTVar3 = (TCGTemp *)((long)&s->pool_cur + (long)pTVar2);
    local_58 = local_58 + (long)s;
    func = helper_dextr_r_l_mips64el;
    goto LAB_009aab52;
  case 0x16:
    tcg_gen_op2_mips64el(s,INDEX_op_movi_i64,(TCGArg)local_40,(ulong)(uint)v2);
    tcg_gen_op2_mips64el(s,INDEX_op_movi_i64,(TCGArg)pTVar3,(ulong)(uint)v1);
    local_58 = s->cpu_env;
    pTVar2 = s->cpu_gpr[(uint)ret];
    local_60 = pTVar4;
    goto LAB_009aab43;
  case 0x17:
    tcg_gen_op2_mips64el(s,INDEX_op_movi_i64,(TCGArg)local_40,(ulong)(uint)v2);
    local_58 = s->cpu_env;
    pTVar2 = s->cpu_gpr[(uint)ret];
    local_60 = pTVar6;
LAB_009aab43:
    local_60 = local_60 + (long)&s->pool_cur;
    pTVar3 = (TCGTemp *)((long)&s->pool_cur + (long)pTVar2);
    local_58 = local_58 + (long)s;
    func = helper_dextr_rs_l_mips64el;
    goto LAB_009aab52;
  case 0x1a:
    uVar1 = local_48->opcode;
    tcg_gen_op2_mips64el(s,INDEX_op_movi_i64,(TCGArg)local_40,(ulong)(uVar1 >> 0x13 & 0x7f));
    tcg_gen_op2_mips64el(s,INDEX_op_movi_i64,(TCGArg)pTVar3,(ulong)(uVar1 >> 0xb & 3));
    local_58 = s->cpu_env;
    local_60 = pTVar4;
    pTVar2 = pTVar5;
    goto LAB_009aa732;
  case 0x1b:
    tcg_gen_op2_mips64el(s,INDEX_op_movi_i64,(TCGArg)local_40,(ulong)(local_48->opcode >> 0xb & 3));
    local_58 = s->cpu_env;
    local_60 = pTVar5;
    pTVar2 = pTVar6;
LAB_009aa732:
    local_68 = (TCGTemp *)(pTVar2 + (long)&s->pool_cur);
    local_60 = local_60 + (long)&s->pool_cur;
    local_58 = local_58 + (long)s;
    func = helper_dshilo_mips64el;
LAB_009aabe0:
    pTVar3 = (TCGTemp *)0x0;
    goto LAB_009aab55;
  case 0x1f:
    tcg_gen_op2_mips64el(s,INDEX_op_movi_i64,(TCGArg)local_40,(ulong)(uint)ret);
    local_58 = s->cpu_env + (long)s;
    local_68 = (TCGTemp *)((long)s + (long)pTVar6);
    local_60 = (TCGv_i64)((long)s + (long)pTVar5);
    func = helper_dmthlip_mips64el;
    goto LAB_009aabe0;
  }
  local_60 = local_60 + (long)&s->pool_cur;
  pTVar3 = (TCGTemp *)((long)&s->pool_cur + (long)pTVar2);
  local_58 = local_58 + (long)s;
  func = helper_dextr_w_mips64el;
LAB_009aab52:
  local_68 = (TCGTemp *)((long)s + (long)pTVar5);
LAB_009aab55:
  nargs = 3;
LAB_009aab5a:
  tcg_gen_callN_mips64el(s,func,pTVar3,nargs,&local_68);
switchD_009a9fdc_caseD_8:
  tcg_temp_free_internal_mips64el(s,(TCGTemp *)(pTVar5 + (long)s));
  tcg_temp_free_internal_mips64el(s,(TCGTemp *)(pTVar4 + (long)s));
  tcg_temp_free_internal_mips64el(s,(TCGTemp *)(pTVar6 + (long)s));
  tcg_temp_free_internal_mips64el(s,(TCGTemp *)((TCGv_i64)((long)a1_00 - (long)s) + (long)s));
  return;
}

Assistant:

static void gen_mipsdsp_accinsn(DisasContext *ctx, uint32_t op1, uint32_t op2,
                                int ret, int v1, int v2, int check_ret)

{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv t0;
    TCGv t1;
    TCGv v1_t;
    TCGv v2_t;
    int16_t imm;

    if ((ret == 0) && (check_ret == 1)) {
        /* Treat as NOP. */
        return;
    }

    t0 = tcg_temp_new(tcg_ctx);
    t1 = tcg_temp_new(tcg_ctx);
    v1_t = tcg_temp_new(tcg_ctx);
    v2_t = tcg_temp_new(tcg_ctx);

    gen_load_gpr(tcg_ctx, v1_t, v1);
    gen_load_gpr(tcg_ctx, v2_t, v2);

    switch (op1) {
    case OPC_EXTR_W_DSP:
        check_dsp(ctx);
        switch (op2) {
        case OPC_EXTR_W:
            tcg_gen_movi_tl(tcg_ctx, t0, v2);
            tcg_gen_movi_tl(tcg_ctx, t1, v1);
            gen_helper_extr_w(tcg_ctx, tcg_ctx->cpu_gpr[ret], t0, t1, tcg_ctx->cpu_env);
            break;
        case OPC_EXTR_R_W:
            tcg_gen_movi_tl(tcg_ctx, t0, v2);
            tcg_gen_movi_tl(tcg_ctx, t1, v1);
            gen_helper_extr_r_w(tcg_ctx, tcg_ctx->cpu_gpr[ret], t0, t1, tcg_ctx->cpu_env);
            break;
        case OPC_EXTR_RS_W:
            tcg_gen_movi_tl(tcg_ctx, t0, v2);
            tcg_gen_movi_tl(tcg_ctx, t1, v1);
            gen_helper_extr_rs_w(tcg_ctx, tcg_ctx->cpu_gpr[ret], t0, t1, tcg_ctx->cpu_env);
            break;
        case OPC_EXTR_S_H:
            tcg_gen_movi_tl(tcg_ctx, t0, v2);
            tcg_gen_movi_tl(tcg_ctx, t1, v1);
            gen_helper_extr_s_h(tcg_ctx, tcg_ctx->cpu_gpr[ret], t0, t1, tcg_ctx->cpu_env);
            break;
        case OPC_EXTRV_S_H:
            tcg_gen_movi_tl(tcg_ctx, t0, v2);
            gen_helper_extr_s_h(tcg_ctx, tcg_ctx->cpu_gpr[ret], t0, v1_t, tcg_ctx->cpu_env);
            break;
        case OPC_EXTRV_W:
            tcg_gen_movi_tl(tcg_ctx, t0, v2);
            gen_helper_extr_w(tcg_ctx, tcg_ctx->cpu_gpr[ret], t0, v1_t, tcg_ctx->cpu_env);
            break;
        case OPC_EXTRV_R_W:
            tcg_gen_movi_tl(tcg_ctx, t0, v2);
            gen_helper_extr_r_w(tcg_ctx, tcg_ctx->cpu_gpr[ret], t0, v1_t, tcg_ctx->cpu_env);
            break;
        case OPC_EXTRV_RS_W:
            tcg_gen_movi_tl(tcg_ctx, t0, v2);
            gen_helper_extr_rs_w(tcg_ctx, tcg_ctx->cpu_gpr[ret], t0, v1_t, tcg_ctx->cpu_env);
            break;
        case OPC_EXTP:
            tcg_gen_movi_tl(tcg_ctx, t0, v2);
            tcg_gen_movi_tl(tcg_ctx, t1, v1);
            gen_helper_extp(tcg_ctx, tcg_ctx->cpu_gpr[ret], t0, t1, tcg_ctx->cpu_env);
            break;
        case OPC_EXTPV:
            tcg_gen_movi_tl(tcg_ctx, t0, v2);
            gen_helper_extp(tcg_ctx, tcg_ctx->cpu_gpr[ret], t0, v1_t, tcg_ctx->cpu_env);
            break;
        case OPC_EXTPDP:
            tcg_gen_movi_tl(tcg_ctx, t0, v2);
            tcg_gen_movi_tl(tcg_ctx, t1, v1);
            gen_helper_extpdp(tcg_ctx, tcg_ctx->cpu_gpr[ret], t0, t1, tcg_ctx->cpu_env);
            break;
        case OPC_EXTPDPV:
            tcg_gen_movi_tl(tcg_ctx, t0, v2);
            gen_helper_extpdp(tcg_ctx, tcg_ctx->cpu_gpr[ret], t0, v1_t, tcg_ctx->cpu_env);
            break;
        case OPC_SHILO:
            imm = (ctx->opcode >> 20) & 0x3F;
            tcg_gen_movi_tl(tcg_ctx, t0, ret);
            tcg_gen_movi_tl(tcg_ctx, t1, imm);
            gen_helper_shilo(tcg_ctx, t0, t1, tcg_ctx->cpu_env);
            break;
        case OPC_SHILOV:
            tcg_gen_movi_tl(tcg_ctx, t0, ret);
            gen_helper_shilo(tcg_ctx, t0, v1_t, tcg_ctx->cpu_env);
            break;
        case OPC_MTHLIP:
            tcg_gen_movi_tl(tcg_ctx, t0, ret);
            gen_helper_mthlip(tcg_ctx, t0, v1_t, tcg_ctx->cpu_env);
            break;
        case OPC_WRDSP:
            imm = (ctx->opcode >> 11) & 0x3FF;
            tcg_gen_movi_tl(tcg_ctx, t0, imm);
            gen_helper_wrdsp(tcg_ctx, v1_t, t0, tcg_ctx->cpu_env);
            break;
        case OPC_RDDSP:
            imm = (ctx->opcode >> 16) & 0x03FF;
            tcg_gen_movi_tl(tcg_ctx, t0, imm);
            gen_helper_rddsp(tcg_ctx, tcg_ctx->cpu_gpr[ret], t0, tcg_ctx->cpu_env);
            break;
        }
        break;
#ifdef TARGET_MIPS64
    case OPC_DEXTR_W_DSP:
        check_dsp(ctx);
        switch (op2) {
        case OPC_DMTHLIP:
            tcg_gen_movi_tl(tcg_ctx, t0, ret);
            gen_helper_dmthlip(tcg_ctx, v1_t, t0, tcg_ctx->cpu_env);
            break;
        case OPC_DSHILO:
            {
                int shift = (ctx->opcode >> 19) & 0x7F;
                int ac = (ctx->opcode >> 11) & 0x03;
                tcg_gen_movi_tl(tcg_ctx, t0, shift);
                tcg_gen_movi_tl(tcg_ctx, t1, ac);
                gen_helper_dshilo(tcg_ctx, t0, t1, tcg_ctx->cpu_env);
                break;
            }
        case OPC_DSHILOV:
            {
                int ac = (ctx->opcode >> 11) & 0x03;
                tcg_gen_movi_tl(tcg_ctx, t0, ac);
                gen_helper_dshilo(tcg_ctx, v1_t, t0, tcg_ctx->cpu_env);
                break;
            }
        case OPC_DEXTP:
            tcg_gen_movi_tl(tcg_ctx, t0, v2);
            tcg_gen_movi_tl(tcg_ctx, t1, v1);

            gen_helper_dextp(tcg_ctx, tcg_ctx->cpu_gpr[ret], t0, t1, tcg_ctx->cpu_env);
            break;
        case OPC_DEXTPV:
            tcg_gen_movi_tl(tcg_ctx, t0, v2);
            gen_helper_dextp(tcg_ctx, tcg_ctx->cpu_gpr[ret], t0, v1_t, tcg_ctx->cpu_env);
            break;
        case OPC_DEXTPDP:
            tcg_gen_movi_tl(tcg_ctx, t0, v2);
            tcg_gen_movi_tl(tcg_ctx, t1, v1);
            gen_helper_dextpdp(tcg_ctx, tcg_ctx->cpu_gpr[ret], t0, t1, tcg_ctx->cpu_env);
            break;
        case OPC_DEXTPDPV:
            tcg_gen_movi_tl(tcg_ctx, t0, v2);
            gen_helper_dextpdp(tcg_ctx, tcg_ctx->cpu_gpr[ret], t0, v1_t, tcg_ctx->cpu_env);
            break;
        case OPC_DEXTR_L:
            tcg_gen_movi_tl(tcg_ctx, t0, v2);
            tcg_gen_movi_tl(tcg_ctx, t1, v1);
            gen_helper_dextr_l(tcg_ctx, tcg_ctx->cpu_gpr[ret], t0, t1, tcg_ctx->cpu_env);
            break;
        case OPC_DEXTR_R_L:
            tcg_gen_movi_tl(tcg_ctx, t0, v2);
            tcg_gen_movi_tl(tcg_ctx, t1, v1);
            gen_helper_dextr_r_l(tcg_ctx, tcg_ctx->cpu_gpr[ret], t0, t1, tcg_ctx->cpu_env);
            break;
        case OPC_DEXTR_RS_L:
            tcg_gen_movi_tl(tcg_ctx, t0, v2);
            tcg_gen_movi_tl(tcg_ctx, t1, v1);
            gen_helper_dextr_rs_l(tcg_ctx, tcg_ctx->cpu_gpr[ret], t0, t1, tcg_ctx->cpu_env);
            break;
        case OPC_DEXTR_W:
            tcg_gen_movi_tl(tcg_ctx, t0, v2);
            tcg_gen_movi_tl(tcg_ctx, t1, v1);
            gen_helper_dextr_w(tcg_ctx, tcg_ctx->cpu_gpr[ret], t0, t1, tcg_ctx->cpu_env);
            break;
        case OPC_DEXTR_R_W:
            tcg_gen_movi_tl(tcg_ctx, t0, v2);
            tcg_gen_movi_tl(tcg_ctx, t1, v1);
            gen_helper_dextr_r_w(tcg_ctx, tcg_ctx->cpu_gpr[ret], t0, t1, tcg_ctx->cpu_env);
            break;
        case OPC_DEXTR_RS_W:
            tcg_gen_movi_tl(tcg_ctx, t0, v2);
            tcg_gen_movi_tl(tcg_ctx, t1, v1);
            gen_helper_dextr_rs_w(tcg_ctx, tcg_ctx->cpu_gpr[ret], t0, t1, tcg_ctx->cpu_env);
            break;
        case OPC_DEXTR_S_H:
            tcg_gen_movi_tl(tcg_ctx, t0, v2);
            tcg_gen_movi_tl(tcg_ctx, t1, v1);
            gen_helper_dextr_s_h(tcg_ctx, tcg_ctx->cpu_gpr[ret], t0, t1, tcg_ctx->cpu_env);
            break;
        case OPC_DEXTRV_S_H:
            tcg_gen_movi_tl(tcg_ctx, t0, v2);
            tcg_gen_movi_tl(tcg_ctx, t1, v1);
            gen_helper_dextr_s_h(tcg_ctx, tcg_ctx->cpu_gpr[ret], t0, t1, tcg_ctx->cpu_env);
            break;
        case OPC_DEXTRV_L:
            tcg_gen_movi_tl(tcg_ctx, t0, v2);
            gen_helper_dextr_l(tcg_ctx, tcg_ctx->cpu_gpr[ret], t0, v1_t, tcg_ctx->cpu_env);
            break;
        case OPC_DEXTRV_R_L:
            tcg_gen_movi_tl(tcg_ctx, t0, v2);
            gen_helper_dextr_r_l(tcg_ctx, tcg_ctx->cpu_gpr[ret], t0, v1_t, tcg_ctx->cpu_env);
            break;
        case OPC_DEXTRV_RS_L:
            tcg_gen_movi_tl(tcg_ctx, t0, v2);
            gen_helper_dextr_rs_l(tcg_ctx, tcg_ctx->cpu_gpr[ret], t0, v1_t, tcg_ctx->cpu_env);
            break;
        case OPC_DEXTRV_W:
            tcg_gen_movi_tl(tcg_ctx, t0, v2);
            gen_helper_dextr_w(tcg_ctx, tcg_ctx->cpu_gpr[ret], t0, v1_t, tcg_ctx->cpu_env);
            break;
        case OPC_DEXTRV_R_W:
            tcg_gen_movi_tl(tcg_ctx, t0, v2);
            gen_helper_dextr_r_w(tcg_ctx, tcg_ctx->cpu_gpr[ret], t0, v1_t, tcg_ctx->cpu_env);
            break;
        case OPC_DEXTRV_RS_W:
            tcg_gen_movi_tl(tcg_ctx, t0, v2);
            gen_helper_dextr_rs_w(tcg_ctx, tcg_ctx->cpu_gpr[ret], t0, v1_t, tcg_ctx->cpu_env);
            break;
        }
        break;
#endif
    }

    tcg_temp_free(tcg_ctx, t0);
    tcg_temp_free(tcg_ctx, t1);
    tcg_temp_free(tcg_ctx, v1_t);
    tcg_temp_free(tcg_ctx, v2_t);
}